

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

QSize __thiscall QMenu::sizeHint(QMenu *this)

{
  QMenuPrivate *this_00;
  long lVar1;
  QRect *pQVar2;
  int iVar3;
  int iVar4;
  QStyle *pQVar5;
  QSize QVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QSize s;
  QStyleOption opt;
  int local_80;
  int iStack_7c;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  local_78 = (undefined1  [16])QMenuPrivate::popupGeometry(this_00,(QScreen *)0x0);
  QMenuPrivate::updateActionRects(this_00,(QRect *)local_78);
  iStack_7c = -1;
  iVar8 = iStack_7c;
  local_80 = -1;
  iVar4 = local_80;
  iStack_7c = -1;
  iVar3 = iStack_7c;
  lVar1 = (this_00->actionRects).d.size;
  iStack_7c = iVar8;
  if (lVar1 != 0) {
    local_80 = -1;
    iStack_7c = -1;
    pQVar2 = (this_00->actionRects).d.ptr;
    lVar7 = 0;
    iVar8 = iStack_7c;
    iVar9 = local_80;
    local_80 = iVar4;
    iStack_7c = iVar3;
    do {
      iVar4 = *(int *)((long)&(pQVar2->y2).m_i + lVar7);
      if ((*(int *)((long)&(pQVar2->x2).m_i + lVar7) !=
           *(int *)((long)&(pQVar2->x1).m_i + lVar7) + -1) ||
         (iVar4 != *(int *)((long)&(pQVar2->y1).m_i + lVar7) + -1)) {
        if (iVar8 <= iVar4) {
          iVar8 = iVar4 + 1;
          iStack_7c = iVar8;
        }
        iVar4 = *(int *)((long)&(pQVar2->x2).m_i + lVar7);
        if (iVar9 <= iVar4) {
          iVar9 = iVar4 + 1;
          local_80 = iVar9;
        }
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar1 << 4 != lVar7);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_78,0,0);
  QStyleOption::initFrom((QStyleOption *)local_78,&this->super_QWidget);
  pQVar5 = QWidget::style(&this->super_QWidget);
  iVar4 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x1e,(QStyleOption *)local_78,this);
  pQVar5 = QWidget::style(&this->super_QWidget);
  iVar8 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x1c,(QStyleOption *)local_78,this);
  local_80 = local_80 + (int)(this_00->super_QWidgetPrivate).rightmargin + iVar8 + iVar4;
  pQVar5 = QWidget::style(&this->super_QWidget);
  iVar8 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x1d,(QStyleOption *)local_78,this);
  _local_80 = CONCAT44(iStack_7c + (int)(this_00->super_QWidgetPrivate).bottommargin + iVar8 + iVar4
                       ,local_80);
  pQVar5 = QWidget::style(&this->super_QWidget);
  QVar6 = (QSize)(**(code **)(*(long *)pQVar5 + 0xe8))
                           (pQVar5,10,(QStyleOption *)local_78,&local_80,this);
  QStyleOption::~QStyleOption((QStyleOption *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMenu::sizeHint() const
{
    Q_D(const QMenu);
    d->updateActionRects();

    QSize s;
    for (int i = 0; i < d->actionRects.size(); ++i) {
        const QRect &rect = d->actionRects.at(i);
        if (rect.isNull())
            continue;
        if (rect.bottom() >= s.height())
            s.setHeight(rect.y() + rect.height());
        if (rect.right() >= s.width())
            s.setWidth(rect.x() + rect.width());
    }
    // Note that the action rects calculated above already include
    // the top and left margins, so we only need to add margins for
    // the bottom and right.
    QStyleOption opt(0);
    opt.initFrom(this);
    const int fw = style()->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, this);
    s.rwidth() += style()->pixelMetric(QStyle::PM_MenuHMargin, &opt, this) + fw + d->rightmargin;
    s.rheight() += style()->pixelMetric(QStyle::PM_MenuVMargin, &opt, this) + fw + d->bottommargin;

    return style()->sizeFromContents(QStyle::CT_Menu, &opt, s, this);
}